

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMemMultipleWritebackInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  MCInst *mcInst;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t Val;
  uint32_t Val_00;
  uint uVar3;
  DecodeStatus DVar4;
  uint reglist;
  uint pred;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  pred = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x10,4);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  Val_00 = fieldFromInstruction_4(Address_local._4_4_,0,0x10);
  if (Val == 0xf) {
    uVar3 = MCInst_getOpcode(pMStack_18);
    if (uVar3 == 0x8e) {
      MCInst_setOpcode(pMStack_18,0x118);
    }
    else if (uVar3 == 0x8f) {
      MCInst_setOpcode(pMStack_18,0x119);
    }
    else if (uVar3 == 0x90) {
      MCInst_setOpcode(pMStack_18,0x11a);
    }
    else if (uVar3 == 0x91) {
      MCInst_setOpcode(pMStack_18,0x11b);
    }
    else if (uVar3 == 0x92) {
      MCInst_setOpcode(pMStack_18,0x11c);
    }
    else if (uVar3 == 0x94) {
      MCInst_setOpcode(pMStack_18,0x11d);
    }
    else if (uVar3 == 0x95) {
      MCInst_setOpcode(pMStack_18,0x11e);
    }
    else if (uVar3 == 0x96) {
      MCInst_setOpcode(pMStack_18,0x11f);
    }
    else if (uVar3 == 0x195) {
      MCInst_setOpcode(pMStack_18,0x171);
    }
    else if (uVar3 == 0x196) {
      MCInst_setOpcode(pMStack_18,0x172);
    }
    else if (uVar3 == 0x197) {
      MCInst_setOpcode(pMStack_18,0x173);
    }
    else if (uVar3 == 0x198) {
      MCInst_setOpcode(pMStack_18,0x174);
    }
    else if (uVar3 == 0x199) {
      MCInst_setOpcode(pMStack_18,0x175);
    }
    else if (uVar3 == 0x19a) {
      MCInst_setOpcode(pMStack_18,0x176);
    }
    else if (uVar3 == 0x19b) {
      MCInst_setOpcode(pMStack_18,0x177);
    }
    else {
      if (uVar3 != 0x19c) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(pMStack_18,0x178);
    }
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x14,1);
    if (uVar2 == 0) {
      uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
      if ((uVar2 == 1) &&
         (uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x14,1), mcInst = pMStack_18,
         uVar2 == 0)) {
        uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,4);
        MCOperand_CreateImm0(mcInst,(ulong)uVar2);
        return pred;
      }
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      Inst_local._4_4_ =
           DecodeRFEInstruction(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Rn);
    }
  }
  else {
    DVar4 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&pred,DVar4);
    if (_Var1) {
      DVar4 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&pred,DVar4);
      if (_Var1) {
        DVar4 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_Rn);
        _Var1 = Check(&pred,DVar4);
        if (_Var1) {
          DVar4 = DecodeRegListOperand(pMStack_18,Val_00,(uint64_t)Decoder_local,_Rn);
          _Var1 = Check(&pred,DVar4);
          if (_Var1) {
            Inst_local._4_4_ = pred;
          }
          else {
            Inst_local._4_4_ = MCDisassembler_Fail;
          }
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeMemMultipleWritebackInstruction(MCInst *Inst,
		unsigned Insn, uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reglist = fieldFromInstruction_4(Insn, 0, 16);

	if (pred == 0xF) {
		// Ambiguous with RFE and SRS
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDMDA:
				MCInst_setOpcode(Inst, ARM_RFEDA);
				break;
			case ARM_LDMDA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDA_UPD);
				break;
			case ARM_LDMDB:
				MCInst_setOpcode(Inst, ARM_RFEDB);
				break;
			case ARM_LDMDB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDB_UPD);
				break;
			case ARM_LDMIA:
				MCInst_setOpcode(Inst, ARM_RFEIA);
				break;
			case ARM_LDMIA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIA_UPD);
				break;
			case ARM_LDMIB:
				MCInst_setOpcode(Inst, ARM_RFEIB);
				break;
			case ARM_LDMIB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIB_UPD);
				break;
			case ARM_STMDA:
				MCInst_setOpcode(Inst, ARM_SRSDA);
				break;
			case ARM_STMDA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDA_UPD);
				break;
			case ARM_STMDB:
				MCInst_setOpcode(Inst, ARM_SRSDB);
				break;
			case ARM_STMDB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDB_UPD);
				break;
			case ARM_STMIA:
				MCInst_setOpcode(Inst, ARM_SRSIA);
				break;
			case ARM_STMIA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIA_UPD);
				break;
			case ARM_STMIB:
				MCInst_setOpcode(Inst, ARM_SRSIB);
				break;
			case ARM_STMIB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIB_UPD);
				break;
			default:
				return MCDisassembler_Fail;
		}

		// For stores (which become SRS's, the only operand is the mode.
		if (fieldFromInstruction_4(Insn, 20, 1) == 0) {
			// Check SRS encoding constraints
			if (!(fieldFromInstruction_4(Insn, 22, 1) == 1 &&
						fieldFromInstruction_4(Insn, 20, 1) == 0))
				return MCDisassembler_Fail;

			MCOperand_CreateImm0(Inst, fieldFromInstruction_4(Insn, 0, 4));
			return S;
		}

		return DecodeRFEInstruction(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail; // Tied
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeRegListOperand(Inst, reglist, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}